

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall sglr::ReferenceContext::depthFunc(ReferenceContext *this,deUint32 func)

{
  if ((func & 0xfffffff8) == 0x200) {
    this->m_depthFunc = func;
    return;
  }
  if (this->m_lastError != 0) {
    return;
  }
  this->m_lastError = 0x500;
  return;
}

Assistant:

static bool isValidCompareFunc (deUint32 func)
{
	switch (func)
	{
		case GL_NEVER:
		case GL_LESS:
		case GL_LEQUAL:
		case GL_GREATER:
		case GL_GEQUAL:
		case GL_EQUAL:
		case GL_NOTEQUAL:
		case GL_ALWAYS:
			return true;

		default:
			return false;
	}
}